

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_set_new_window_title(char *title)

{
  long lVar1;
  long *plVar2;
  size_t sVar3;
  size_t sVar4;
  
  plVar2 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar2 == 0) {
    *plVar2 = (long)(plVar2 + 1);
    initialize_tls_values((thread_local_state *)(plVar2 + 1));
  }
  lVar1 = *plVar2;
  if (lVar1 != 0) {
    sVar3 = strlen(title);
    sVar4 = 0xff;
    if (sVar3 < 0xff) {
      sVar4 = sVar3;
    }
    _al_sane_strncpy((char *)(lVar1 + 0x124),title,sVar4 + 1);
    return;
  }
  return;
}

Assistant:

void al_set_new_window_title(const char *title)
{
   thread_local_state *tls;
   size_t size;

   if ((tls = tls_get()) == NULL)
      return;

   size = strlen(title);

   if (size > ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE) {
      size = ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE;
   }

   _al_sane_strncpy(tls->new_window_title, title, size + 1);
}